

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::PipelineResourceSignatureGLImpl::DvpValidateCommittedResource
          (PipelineResourceSignatureGLImpl *this,GLResourceAttribs *GLAttribs,
          RESOURCE_DIMENSION ResourceDim,bool IsMultisample,Uint32 ResIndex,
          ShaderResourceCacheGL *ResourceCache,char *ShaderName,char *PSOName)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  BINDING_RANGE ArrayIndex;
  Uint32 UVar4;
  CachedResourceView *pCVar5;
  ITextureView *pIVar6;
  IBufferView *pIVar7;
  BufferGLImpl *pBVar8;
  undefined7 in_register_00000009;
  PipelineResourceSignatureGLImpl *Args_1;
  ResourceAttribs *Res;
  bool bVar9;
  PipelineResourceDesc *pPVar10;
  Uint32 ArrInd_1;
  uint uVar11;
  Uint32 ArrInd;
  char (*in_stack_ffffffffffffff58) [2];
  string msg;
  String local_50;
  
  if ((this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < m_Desc.NumResources",
               (char (*) [31])CONCAT71(in_register_00000009,IsMultisample));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0x221);
    std::__cxx11::string::~string((string *)&msg);
  }
  pPVar10 = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
            .m_Desc.Resources;
  Res = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).m_pResourceAttribs
        + ResIndex;
  Args_1 = this;
  iVar3 = strcmp(pPVar10[ResIndex].Name,GLAttribs->Name);
  if (iVar3 != 0) {
    FormatString<char[28]>(&msg,(char (*) [28])"Inconsistent resource names");
    Args_1 = (PipelineResourceSignatureGLImpl *)0x224;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0x224);
    std::__cxx11::string::~string((string *)&msg);
  }
  pPVar10 = pPVar10 + ResIndex;
  bVar9 = true;
  if (pPVar10->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
    if (pPVar10->ArraySize < GLAttribs->ArraySize) {
      FormatString<char[26],char[41]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GLAttribs.ArraySize <= ResDesc.ArraySize",(char (*) [41])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                 ,0x229);
      std::__cxx11::string::~string((string *)&msg);
    }
    ArrayIndex = PipelineResourceToBindingRange(pPVar10);
    switch(ArrayIndex) {
    case BINDING_RANGE_UNIFORM_BUFFER:
      bVar9 = true;
      for (; ArrayIndex < GLAttribs->ArraySize; ArrayIndex = ArrayIndex + BINDING_RANGE_TEXTURE) {
        bVar2 = ShaderResourceCacheGL::IsUBBound(ResourceCache,Res->CacheOffset + ArrayIndex);
        if (!bVar2) {
          GetShaderResourcePrintName<Diligent::ShaderResourcesGL::GLResourceAttribs>
                    (&local_50,GLAttribs,ArrayIndex);
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    (&msg,(Diligent *)"No resource is bound to variable \'",(char (*) [35])&local_50
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      "\' in shader \'",(char (*) [14])&ShaderName,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x6cec4a,in_stack_ffffffffffffff58);
          std::__cxx11::string::~string((string *)&local_50);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
          bVar9 = false;
        }
      }
      break;
    case BINDING_RANGE_TEXTURE:
      bVar9 = true;
      for (uVar11 = 0; uVar11 < GLAttribs->ArraySize; uVar11 = uVar11 + 1) {
        bVar2 = ShaderResourceCacheGL::IsTextureBound
                          (ResourceCache,Res->CacheOffset + uVar11,
                           pPVar10->ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT ||
                           pPVar10->ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV);
        if (bVar2) {
          pCVar5 = ShaderResourceCacheGL::GetConstTexture(ResourceCache,Res->CacheOffset + uVar11);
          pcVar1 = GLAttribs->Name;
          UVar4 = GLAttribs->ArraySize;
          if (pCVar5->pTexture == (TextureBaseGL *)0x0) {
            pIVar7 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::IBufferView>
                               (&pCVar5->pView);
            ValidateResourceViewDimension<Diligent::IBufferView>
                      (pcVar1,UVar4,uVar11,pIVar7,ResourceDim,IsMultisample);
          }
          else {
            pIVar6 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::ITextureView>
                               (&pCVar5->pView);
            ValidateResourceViewDimension<Diligent::ITextureView>
                      (pcVar1,UVar4,uVar11,pIVar6,ResourceDim,IsMultisample);
          }
          UVar4 = GetImmutableSamplerIdx(this,Res);
          if (UVar4 != 0xffffffff) {
            pBVar8 = (pCVar5->field_2).pBuffer;
            if (pBVar8 == (BufferGLImpl *)0x0) {
              FormatString<char[66]>
                        (&msg,(char (*) [66])
                              "Immutable sampler is not initialized in the cache - this is a bug");
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                         ,0x25d);
              std::__cxx11::string::~string((string *)&msg);
              pBVar8 = (pCVar5->field_2).pBuffer;
            }
            if (pBVar8 != (BufferGLImpl *)
                          (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                          m_pImmutableSamplers[UVar4].m_pObject) {
              FormatString<char[56]>
                        (&msg,(char (*) [56])
                              "Immutable sampler initialized in the cache is not valid");
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                         ,0x25e);
              std::__cxx11::string::~string((string *)&msg);
            }
          }
        }
        else {
          GetShaderResourcePrintName<Diligent::ShaderResourcesGL::GLResourceAttribs>
                    (&local_50,GLAttribs,uVar11);
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    (&msg,(Diligent *)"No resource is bound to variable \'",(char (*) [35])&local_50
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      "\' in shader \'",(char (*) [14])&ShaderName,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x6cec4a,in_stack_ffffffffffffff58);
          std::__cxx11::string::~string((string *)&local_50);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
          bVar9 = false;
        }
      }
      break;
    case BINDING_RANGE_IMAGE:
      bVar9 = true;
      for (uVar11 = 0; uVar11 < GLAttribs->ArraySize; uVar11 = uVar11 + 1) {
        bVar2 = ShaderResourceCacheGL::IsImageBound
                          (ResourceCache,Res->CacheOffset + uVar11,
                           (pPVar10->ResourceType - SHADER_RESOURCE_TYPE_TEXTURE_SRV & 0xfd) == 0);
        if (bVar2) {
          pCVar5 = ShaderResourceCacheGL::GetConstImage(ResourceCache,Res->CacheOffset + uVar11);
          pcVar1 = GLAttribs->Name;
          UVar4 = GLAttribs->ArraySize;
          if (pCVar5->pTexture == (TextureBaseGL *)0x0) {
            pIVar7 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::IBufferView>
                               (&pCVar5->pView);
            ValidateResourceViewDimension<Diligent::IBufferView>
                      (pcVar1,UVar4,uVar11,pIVar7,ResourceDim,IsMultisample);
          }
          else {
            pIVar6 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::ITextureView>
                               (&pCVar5->pView);
            ValidateResourceViewDimension<Diligent::ITextureView>
                      (pcVar1,UVar4,uVar11,pIVar6,ResourceDim,IsMultisample);
          }
        }
        else {
          GetShaderResourcePrintName<Diligent::ShaderResourcesGL::GLResourceAttribs>
                    (&local_50,GLAttribs,uVar11);
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    (&msg,(Diligent *)"No resource is bound to variable \'",(char (*) [35])&local_50
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      "\' in shader \'",(char (*) [14])&ShaderName,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x6cec4a,in_stack_ffffffffffffff58);
          std::__cxx11::string::~string((string *)&local_50);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
          bVar9 = false;
        }
      }
      break;
    case BINDING_RANGE_STORAGE_BUFFER:
      bVar9 = true;
      for (uVar11 = 0; uVar11 < GLAttribs->ArraySize; uVar11 = uVar11 + 1) {
        bVar2 = ShaderResourceCacheGL::IsSSBOBound(ResourceCache,Res->CacheOffset + uVar11);
        if (!bVar2) {
          GetShaderResourcePrintName<Diligent::ShaderResourcesGL::GLResourceAttribs>
                    (&local_50,GLAttribs,uVar11);
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    (&msg,(Diligent *)"No resource is bound to variable \'",(char (*) [35])&local_50
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      "\' in shader \'",(char (*) [14])&ShaderName,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x6cec4a,in_stack_ffffffffffffff58);
          std::__cxx11::string::~string((string *)&local_50);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
          bVar9 = false;
        }
      }
      break;
    default:
      FormatString<char[40]>(&msg,(char (*) [40])"Unsupported shader resource range type.");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                 ,0x278);
      bVar9 = true;
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return bVar9;
}

Assistant:

bool PipelineResourceSignatureGLImpl::DvpValidateCommittedResource(const ShaderResourcesGL::GLResourceAttribs& GLAttribs,
                                                                   RESOURCE_DIMENSION                          ResourceDim,
                                                                   bool                                        IsMultisample,
                                                                   Uint32                                      ResIndex,
                                                                   const ShaderResourceCacheGL&                ResourceCache,
                                                                   const char*                                 ShaderName,
                                                                   const char*                                 PSOName) const
{
    VERIFY_EXPR(ResIndex < m_Desc.NumResources);
    const auto& ResDesc = m_Desc.Resources[ResIndex];
    const auto& ResAttr = m_pResourceAttribs[ResIndex];
    VERIFY(strcmp(ResDesc.Name, GLAttribs.Name) == 0, "Inconsistent resource names");

    if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
        return true; // Skip separate samplers

    VERIFY_EXPR(GLAttribs.ArraySize <= ResDesc.ArraySize);

    bool BindingsOK = true;

    static_assert(BINDING_RANGE_COUNT == 4, "Please update the switch below to handle the new shader resource range");
    switch (PipelineResourceToBindingRange(ResDesc))
    {
        case BINDING_RANGE_UNIFORM_BUFFER:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                if (!ResourceCache.IsUBBound(ResAttr.CacheOffset + ArrInd))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                }
            }
            break;

        case BINDING_RANGE_STORAGE_BUFFER:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                if (!ResourceCache.IsSSBOBound(ResAttr.CacheOffset + ArrInd))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                }
            }
            break;

        case BINDING_RANGE_TEXTURE:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                const bool IsTexView = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT);
                if (!ResourceCache.IsTextureBound(ResAttr.CacheOffset + ArrInd, IsTexView))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                    continue;
                }

                const auto& Tex = ResourceCache.GetConstTexture(ResAttr.CacheOffset + ArrInd);
                if (Tex.pTexture)
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Tex.pView.RawPtr<ITextureView>(), ResourceDim, IsMultisample);
                else
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Tex.pView.RawPtr<IBufferView>(), ResourceDim, IsMultisample);

                const auto ImmutableSamplerIdx = GetImmutableSamplerIdx(ResAttr);
                if (ImmutableSamplerIdx != InvalidImmutableSamplerIndex)
                {
                    VERIFY(Tex.pSampler != nullptr, "Immutable sampler is not initialized in the cache - this is a bug");
                    VERIFY(Tex.pSampler == m_pImmutableSamplers[ImmutableSamplerIdx], "Immutable sampler initialized in the cache is not valid");
                }
            }
            break;

        case BINDING_RANGE_IMAGE:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                const bool IsTexView = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV);
                if (!ResourceCache.IsImageBound(ResAttr.CacheOffset + ArrInd, IsTexView))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                    continue;
                }

                const auto& Img = ResourceCache.GetConstImage(ResAttr.CacheOffset + ArrInd);
                if (Img.pTexture)
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Img.pView.RawPtr<ITextureView>(), ResourceDim, IsMultisample);
                else
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Img.pView.RawPtr<IBufferView>(), ResourceDim, IsMultisample);
            }
            break;

        default:
            UNEXPECTED("Unsupported shader resource range type.");
    }

    return BindingsOK;
}